

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  ulong uVar1;
  CodedOutputStream *in_RDX;
  int in_EDI;
  LogMessage *in_stack_ffffffffffffff68;
  CodedOutputStream *in_stack_ffffffffffffff70;
  LogMessage *this;
  LogMessage *in_stack_ffffffffffffff78;
  LogMessage local_60;
  undefined4 local_8;
  
  local_8 = 2;
  MakeTag(in_EDI,WIRETYPE_LENGTH_DELIMITED);
  io::CodedOutputStream::WriteTag
            (in_stack_ffffffffffffff70,(uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  uVar1 = std::__cxx11::string::size();
  if (0x7fffffff < uVar1) {
    this = &local_60;
    LogMessage::LogMessage
              ((LogMessage *)in_RDX,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (char *)this,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    in_stack_ffffffffffffff78 = LogMessage::operator<<(this,(char *)in_stack_ffffffffffffff68);
    LogFinisher::operator=((LogFinisher *)this,in_stack_ffffffffffffff68);
    LogMessage::~LogMessage((LogMessage *)0x418456);
  }
  std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(in_RDX,(uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  io::CodedOutputStream::WriteString(in_RDX,(string *)in_stack_ffffffffffffff78);
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const std::string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kint32max);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}